

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O1

void __thiscall boost::deflate::inflate_stream_test::run(inflate_stream_test *this)

{
  BoostDecompressor *d;
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"sizeof(inflate_stream) == ",0x1a);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  testInflate((IDecompressor *)this);
  d = &this->beast_decompressor;
  testInflate(&d->super_IDecompressor);
  testInflateErrors((IDecompressor *)this);
  testInflateErrors(&d->super_IDecompressor);
  testInvalidSettings((IDecompressor *)this);
  testInvalidSettings(&d->super_IDecompressor);
  testInvalidHeader((IDecompressor *)this);
  testInvalidHeader(&d->super_IDecompressor);
  testFixedHuffmanFlushTrees((IDecompressor *)this);
  testFixedHuffmanFlushTrees(&d->super_IDecompressor);
  testUncompressedFlushTrees((IDecompressor *)this);
  testUncompressedFlushTrees(&d->super_IDecompressor);
  testWrappedStreams();
  return;
}

Assistant:

void run()
    {
        std::cerr <<
            "sizeof(inflate_stream) == " <<
            sizeof(inflate_stream) << std::endl;

        testInflate(zlib_decompressor);
        testInflate(beast_decompressor);
        testInflateErrors(zlib_decompressor);
        testInflateErrors(beast_decompressor);
        testInvalidSettings(zlib_decompressor);
        testInvalidSettings(beast_decompressor);
        testInvalidHeader(zlib_decompressor);
        testInvalidHeader(beast_decompressor);
        testFixedHuffmanFlushTrees(zlib_decompressor);
        testFixedHuffmanFlushTrees(beast_decompressor);
        testUncompressedFlushTrees(zlib_decompressor);
        testUncompressedFlushTrees(beast_decompressor);
        testWrappedStreams();
    }